

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

void __thiscall Lodtalk::SpecialRuntimeObjects::registerGCRoots(SpecialRuntimeObjects *this)

{
  MemoryManager *this_00;
  GarbageCollector *this_01;
  reference gcroot;
  size_type sVar1;
  Oop *gcroot_00;
  Oop OVar2;
  GarbageCollector *gc;
  SpecialRuntimeObjects *this_local;
  
  this_00 = VMContext::getMemoryManager(this->context);
  this_01 = MemoryManager::getGarbageCollector(this_00);
  gcroot = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::operator[]
                     (&this->specialObjectTable,0);
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  GarbageCollector::registerGCRoot(this_01,gcroot,sVar1);
  gcroot_00 = (Oop *)std::
                     vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                     ::operator[](&this->specialClassTable,0);
  sVar1 = std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::
          size(&this->specialClassTable);
  GarbageCollector::registerGCRoot(this_01,gcroot_00,sVar1);
  OVar2 = nilOop();
  GarbageCollector::registerNativeObject(this_01,OVar2);
  OVar2 = trueOop();
  GarbageCollector::registerNativeObject(this_01,OVar2);
  OVar2 = falseOop();
  GarbageCollector::registerNativeObject(this_01,OVar2);
  return;
}

Assistant:

void SpecialRuntimeObjects::registerGCRoots()
{
    auto gc = context->getMemoryManager()->getGarbageCollector();

    // Register the runtime GC  objects table.
	gc->registerGCRoot(&specialObjectTable[0], specialObjectTable.size());

	// Register the special classes table.
	gc->registerGCRoot((Oop*)&specialClassTable[0], specialClassTable.size());

    // nil, true, false
    gc->registerNativeObject(nilOop());
    gc->registerNativeObject(trueOop());
    gc->registerNativeObject(falseOop());
}